

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O3

void __thiscall
kratos::TaskStmtBlock::TaskStmtBlock(TaskStmtBlock *this,Generator *parent,string *function_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (function_name->_M_dataplus)._M_p;
  paVar1 = &function_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == paVar1) {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_38.field_2._8_8_ = *(undefined8 *)((long)&function_name->field_2 + 8);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  }
  else {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38._M_string_length = function_name->_M_string_length;
  (function_name->_M_dataplus)._M_p = (pointer)paVar1;
  function_name->_M_string_length = 0;
  (function_name->field_2)._M_local_buf[0] = '\0';
  FunctionStmtBlock::FunctionStmtBlock(&this->super_FunctionStmtBlock,parent,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_FunctionStmtBlock).super_StmtBlock.super_Stmt.super_IRNode._vptr_IRNode =
       (_func_int **)&PTR_accept_002b6e80;
  return;
}

Assistant:

TaskStmtBlock(Generator *parent, std::string function_name)
        : FunctionStmtBlock(parent, std::move(function_name)) {}